

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ResultBuilder::captureExpectedException
          (ResultBuilder *this,
          Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *matcher)

{
  pointer pcVar1;
  int iVar2;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  undefined1 local_148 [8];
  AssertionResult result;
  long local_80 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined4 local_50;
  undefined1 *local_48;
  string actualMessage;
  
  if ((this->m_exprComponents).testFalse == false) {
    pcVar1 = (this->m_data).reconstructedExpression._M_dataplus._M_p;
    result.m_resultData._64_8_ = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&result.m_resultData.resultType,pcVar1,
               pcVar1 + (this->m_data).reconstructedExpression._M_string_length);
    pcVar1 = (this->m_data).message._M_dataplus._M_p;
    local_70[0] = &local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar1,pcVar1 + (this->m_data).message._M_string_length);
    local_50 = 0;
    std::__cxx11::string::_M_assign((string *)&result.m_resultData.resultType);
    pIVar3 = getRegistryHub();
    iVar2 = (*pIVar3->_vptr_IRegistryHub[4])(pIVar3);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
              (&local_48,(long *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*(matcher->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
              _vptr_NonCopyable[5])(matcher,&local_48);
    if ((char)iVar2 == '\0') {
      local_50 = 0x11;
      std::__cxx11::string::_M_assign((string *)&result.m_resultData.resultType);
    }
    AssertionResult::AssertionResult
              ((AssertionResult *)local_148,&this->m_assertionInfo,
               (AssertionResultData *)&result.m_resultData.resultType);
    handleResult(this,(AssertionResult *)local_148);
    AssertionResult::~AssertionResult((AssertionResult *)local_148);
    if ((size_type *)local_48 != &actualMessage._M_string_length) {
      operator_delete(local_48,actualMessage._M_string_length + 1);
    }
    if (local_70[0] != &local_60) {
      operator_delete(local_70[0],local_60._M_allocated_capacity + 1);
    }
    if ((long *)result.m_resultData._64_8_ != local_80) {
      operator_delete((void *)result.m_resultData._64_8_,local_80[0] + 1);
    }
    return;
  }
  __assert_fail("m_exprComponents.testFalse == false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sasq64[P]fastzip/src/catch.hpp"
                ,0x2053,
                "void Catch::ResultBuilder::captureExpectedException(const Matchers::Impl::Matcher<std::string> &)"
               );
}

Assistant:

void ResultBuilder::captureExpectedException( Matchers::Impl::Matcher<std::string> const& matcher ) {

        assert( m_exprComponents.testFalse == false );
        AssertionResultData data = m_data;
        data.resultType = ResultWas::Ok;
        data.reconstructedExpression = m_assertionInfo.capturedExpression;

        std::string actualMessage = Catch::translateActiveException();
        if( !matcher.match( actualMessage ) ) {
            data.resultType = ResultWas::ExpressionFailed;
            data.reconstructedExpression = actualMessage;
        }
        AssertionResult result( m_assertionInfo, data );
        handleResult( result );
    }